

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::Person::Clear(Person *this)

{
  uint uVar1;
  uint32 cached_has_bits;
  Person *this_local;
  
  google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::Clear(&this->phones_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->name_);
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->email_);
    }
  }
  this->id_ = 0;
  memset(&this->_has_bits_,0,4);
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8);
  }
  return;
}

Assistant:

void Person::Clear() {
// @@protoc_insertion_point(message_clear_start:Messages.Person)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  phones_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      email_.ClearNonDefaultToEmpty();
    }
  }
  id_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}